

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::
get<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
          (Attribute *this,double t,
          vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *dst,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *__x;
  optional<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
  local_68;
  optional<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
  local_48;
  
  if (dst == (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    bVar1 = primvar::PrimVar::has_value(&this->_var);
    if (bVar1) {
      primvar::PrimVar::
      get_value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                (&local_68,&this->_var);
      local_48.has_value_ = local_68.has_value_;
      if (local_68.has_value_ == true) {
        local_48.contained.data.__align = local_68.contained.data.__align;
        local_48.contained._8_8_ = local_68.contained._8_8_;
        local_48.contained._16_8_ = local_68.contained._16_8_;
        local_68.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_68.contained._8_8_ = 0;
        local_68.contained._16_8_ = 0;
        nonstd::optional_lite::
        optional<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
        ::~optional(&local_68);
        __x = nonstd::optional_lite::
              optional<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
              ::value(&local_48);
        ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
        operator=(dst,__x);
        nonstd::optional_lite::
        optional<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
        ::~optional(&local_48);
        return true;
      }
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::
      ~optional(&local_68);
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::
      ~optional(&local_48);
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar1 = get_value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                      (this,dst);
  }
  else {
    bVar1 = primvar::PrimVar::
            get_interpolated_value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar1;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }